

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

QVariant * __thiscall
QtPrivate::QCalendarModel::data(QCalendarModel *this,QModelIndex *index,int role)

{
  bool bVar1;
  int iVar2;
  int column_00;
  int in_ECX;
  QModelIndex *in_RDX;
  QCalendarModel *in_RSI;
  QCalendarModel *in_RDI;
  long in_FS_OFFSET;
  int column;
  int row;
  QDate date;
  QDate date_1;
  QTextCharFormat fmt;
  QTextFormat *in_stack_ffffffffffffff18;
  QCalendarModel *this_00;
  undefined4 in_stack_ffffffffffffff40;
  QCalendarModel *pQVar3;
  QCalendarModel *this_01;
  undefined1 local_98 [24];
  QBrush local_80 [8];
  QBrush local_78 [8];
  undefined1 local_70 [24];
  undefined8 local_58;
  undefined1 *local_50;
  undefined1 local_48 [24];
  undefined1 *local_30;
  QFont local_28 [16];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ECX == 7) {
    ::QVariant::QVariant((QVariant *)in_RDI,0x84);
    this_00 = in_RDI;
  }
  else {
    this_00 = in_RDI;
    pQVar3 = in_RSI;
    this_01 = in_RDI;
    iVar2 = QModelIndex::row(in_RDX);
    column_00 = QModelIndex::column(in_RDX);
    if (in_ECX == 0) {
      if (((((in_RSI->m_weekNumbersShown & 1U) != 0) && (column_00 == 0)) &&
          (in_RSI->m_firstRow <= iVar2)) && (iVar2 < in_RSI->m_firstRow + 6)) {
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        columnForDayOfWeek(in_RSI,Monday);
        local_30 = (undefined1 *)dateForCell(in_RSI,(int)((ulong)this_00 >> 0x20),(int)this_00);
        bVar1 = QDate::isValid((QDate *)this_00);
        if (bVar1) {
          iVar2 = QDate::weekNumber((int *)&local_30);
          ::QVariant::QVariant((QVariant *)in_RDI,iVar2);
          goto LAB_00519586;
        }
      }
      if (((in_RSI->m_horizontalHeaderFormat == NoHorizontalHeader) || (iVar2 != 0)) ||
         ((column_00 < in_RSI->m_firstColumn || (in_RSI->m_firstColumn + 7 <= column_00)))) {
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_50 = (undefined1 *)dateForCell(in_RSI,(int)((ulong)this_00 >> 0x20),(int)this_00);
        bVar1 = QDate::isValid((QDate *)this_00);
        if (bVar1) {
          local_58 = *(undefined8 *)&in_RSI->m_calendar;
          iVar2 = QDate::day(&local_50,local_58);
          ::QVariant::QVariant((QVariant *)in_RDI,iVar2);
        }
        else {
          QString::QString((QString *)0x519402);
          ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_70);
          QString::~QString((QString *)0x51941b);
        }
      }
      else {
        dayOfWeekForColumn(in_RSI,column_00);
        dayName((QCalendarModel *)CONCAT44(column_00,in_stack_ffffffffffffff40),
                (DayOfWeek)((ulong)in_RSI >> 0x20));
        ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_48);
        QString::~QString((QString *)0x519380);
      }
    }
    else {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      formatForCell(this_01,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3);
      if (in_ECX == 8) {
        QTextFormat::background(in_stack_ffffffffffffff18);
        QBrush::color((QBrush *)0x51947b);
        QColor::operator_cast_to_QVariant((QColor *)in_RDI);
        QBrush::~QBrush(local_78);
      }
      else if (in_ECX == 9) {
        QTextFormat::foreground(in_stack_ffffffffffffff18);
        QBrush::color((QBrush *)0x5194c2);
        QColor::operator_cast_to_QVariant((QColor *)in_RDI);
        QBrush::~QBrush(local_80);
      }
      else if (in_ECX == 6) {
        QTextCharFormat::font();
        QFont::operator_cast_to_QVariant((QFont *)in_RDI);
        QFont::~QFont(local_28);
      }
      else if (in_ECX == 3) {
        QTextCharFormat::toolTip((QTextCharFormat *)in_stack_ffffffffffffff18);
        ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_98);
        QString::~QString((QString *)0x51955d);
      }
      else {
        ::QVariant::QVariant((QVariant *)0x519571);
      }
      QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x519586);
    }
  }
LAB_00519586:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QVariant *)this_00;
}

Assistant:

QVariant QCalendarModel::data(const QModelIndex &index, int role) const
{
    if (role == Qt::TextAlignmentRole)
        return (int) Qt::AlignCenter;

    int row = index.row();
    int column = index.column();

    if (role == Qt::DisplayRole) {
        if (m_weekNumbersShown && column == HeaderColumn
            && row >= m_firstRow && row < m_firstRow + RowCount) {
            QDate date = dateForCell(row, columnForDayOfWeek(Qt::Monday));
            if (date.isValid())
                return date.weekNumber();
        }
        if (m_horizontalHeaderFormat != QCalendarWidget::NoHorizontalHeader && row == HeaderRow
            && column >= m_firstColumn && column < m_firstColumn + ColumnCount)
            return dayName(dayOfWeekForColumn(column));
        QDate date = dateForCell(row, column);
        if (date.isValid())
            return date.day(m_calendar);
        return QString();
    }

    QTextCharFormat fmt = formatForCell(row, column);
    if (role == Qt::BackgroundRole)
        return fmt.background().color();
    if (role == Qt::ForegroundRole)
        return fmt.foreground().color();
    if (role == Qt::FontRole)
        return fmt.font();
    if (role == Qt::ToolTipRole)
        return fmt.toolTip();
    return QVariant();
}